

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<std::complex<long_double>_>::SolveJacobi
          (TPZMatrix<std::complex<long_double>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<long_double>_> *F,TPZFMatrix<std::complex<long_double>_> *result,
          TPZFMatrix<std::complex<long_double>_> *residual,
          TPZFMatrix<std::complex<long_double>_> *scratch,REAL *tol,int FromCurrent)

{
  int iVar1;
  int extraout_var;
  long lVar2;
  long lVar3;
  complex<long_double> *pcVar4;
  long lVar5;
  int64_t i;
  long row;
  TPZFMatrix<std::complex<long_double>_> *pTVar6;
  int64_t ic;
  long col;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  longdouble lVar7;
  complex<long_double> __r;
  complex<long_double> local_78;
  complex<long_double> local_58;
  
  if (FromCurrent == 0) {
    pTVar6 = F;
    TPZFMatrix<std::complex<long_double>_>::operator=(scratch,F);
    (*(result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(result);
  }
  else {
    pTVar6 = result;
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F);
  }
  Norm((longdouble *)scratch,pTVar6);
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  lVar5 = 0;
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (CONCAT44(extraout_var,iVar1) == 0 || extraout_var < 0) {
    lVar2 = lVar5;
  }
  lVar3 = (F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
  if (lVar3 < 1) {
    lVar3 = lVar5;
  }
  while ((lVar5 < *numiterations && (*tol <= ABS((double)in_ST0) && ABS((double)in_ST0) != *tol))) {
    lVar7 = in_ST7;
    for (col = 0; col != lVar3; col = col + 1) {
      for (row = 0; lVar2 != row; row = row + 1) {
        pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()(scratch,row,col);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_58,this,row,row);
        local_78._M_value._0_8_ = *(undefined8 *)pcVar4->_M_value;
        local_78._M_value._16_8_ = *(undefined8 *)(pcVar4->_M_value + 0x10);
        local_78._M_value._24_2_ = SUB82(*(undefined8 *)(pcVar4->_M_value + 0x18),0);
        local_78._M_value._26_6_ = SUB86((ulong)*(undefined8 *)(pcVar4->_M_value + 0x18) >> 0x10,0);
        local_78._M_value._8_2_ = SUB82(*(undefined8 *)(pcVar4->_M_value + 8),0);
        local_78._M_value._10_6_ = SUB86((ulong)*(undefined8 *)(pcVar4->_M_value + 8) >> 0x10,0);
        std::complex<long_double>::operator/=(&local_78,&local_58);
        pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()(result,row,col);
        lVar7 = *(longdouble *)(pcVar4->_M_value + 0x10);
        *(longdouble *)pcVar4->_M_value =
             *(longdouble *)pcVar4->_M_value +
             (longdouble)CONCAT28(local_78._M_value._8_2_,local_78._M_value._0_8_);
        *(longdouble *)(pcVar4->_M_value + 0x10) =
             lVar7 + (longdouble)CONCAT28(local_78._M_value._24_2_,local_78._M_value._16_8_);
        in_ST6 = in_ST5;
        in_ST7 = in_ST5;
        lVar7 = in_ST5;
      }
    }
    pTVar6 = result;
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F,scratch);
    Norm((longdouble *)scratch,pTVar6);
    lVar5 = lVar5 + 1;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = in_ST6;
    in_ST6 = in_ST7;
    in_ST7 = lVar7;
  }
  if (residual != (TPZFMatrix<std::complex<long_double>_> *)0x0) {
    TPZFMatrix<std::complex<long_double>_>::operator=(residual,scratch);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveJacobi(int64_t &numiterations,const TPZFMatrix<TVar> &F, TPZFMatrix<TVar> &result,
								  TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch, REAL &tol,const int FromCurrent) {
	
	
	if(FromCurrent) {
		Residual(result,F,scratch);
	} else {
		scratch = F;
		result.Zero();
	}
	REAL res;
	res = TPZExtractVal::val(Norm(scratch));
	int64_t r = Dim();
	int64_t c = F.Cols();
	for(int64_t it=0; it<numiterations && (fabs(res)) > tol; it++) {
		for(int64_t ic=0; ic<c; ic++) {
			for(int64_t i=0; i<r; i++) {
				result(i,ic) += (scratch)(i,ic)/GetVal(i,i);
			}
		}
		Residual(result,F,scratch);
		res = TPZExtractVal::val(Norm(scratch));
	}
	if(residual) *residual = scratch;
}